

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLower(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int i,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *newLower,bool scale)

{
  ulong *puVar1;
  byte in_CL;
  cpp_dec_float<200U,_int,_void> *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffdd8;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffde0;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  type_conflict5 local_1f9;
  undefined1 local_1f8 [128];
  undefined1 local_178 [128];
  ulong local_f8;
  undefined1 local_ec [131];
  byte local_69;
  cpp_dec_float<200U,_int,_void> *local_68;
  undefined4 local_5c;
  undefined8 local_50;
  ulong *local_48;
  undefined1 *local_40;
  cpp_dec_float<200U,_int,_void> *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  ulong *local_8;
  
  local_69 = in_CL & 1;
  local_1f9 = false;
  local_68 = in_RDX;
  local_5c = in_ESI;
  if (local_69 != 0) {
    puVar1 = (ulong *)infinity();
    local_f8 = *puVar1 ^ 0x8000000000000000;
    local_40 = local_ec;
    local_48 = &local_f8;
    local_50 = 0;
    local_8 = local_48;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_RDX,(double)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0);
    local_1f9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffdd8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x688c8b);
  }
  if (local_1f9 == false) {
    local_10 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lower_w(in_stack_fffffffffffffde0,(int)((ulong)local_68 >> 0x20));
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffffde0,local_68);
  }
  else {
    this_00 = *(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)(in_RDI + 0x218);
    local_30 = local_1f8;
    local_38 = local_68;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)this_00,in_stack_fffffffffffffdd8);
    (**(code **)(*(long *)((array_type *)
                          &this_00->
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )->_M_elems + 0x158))(local_178,this_00,in_RDI,local_5c,local_1f8);
    local_20 = LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lower_w(this_00,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    local_28 = local_178;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)this_00,in_stack_fffffffffffffdd8);
  }
  return;
}

Assistant:

virtual void changeLower(int i, const R& newLower, bool scale = false)
   {
      if(scale && newLower > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::lower_w(i) = lp_scaler->scaleLower(*this, i, newLower);
      }
      else
         LPColSetBase<R>::lower_w(i) = newLower;

      assert(isConsistent());
   }